

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O3

void __thiscall icu_63::NativeItem::setItem(NativeItem *this,Item *item,UDataSwapFn *swap)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  undefined4 uVar6;
  UErrorCode code;
  Item *pIVar7;
  UBool UVar8;
  int iVar9;
  uint uVar10;
  UDataInfo *pUVar11;
  UDataSwapper *pUVar12;
  uint8_t *puVar13;
  long lVar14;
  char *pcVar15;
  undefined8 uVar16;
  uint extraout_EDX;
  void *inData;
  UErrorCode *pErrorCode;
  uint uVar17;
  UErrorCode errorCode;
  int32_t itemHeaderLength;
  int32_t infoLength;
  char acStack_9c [4];
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong uStack_78;
  ulong uStack_70;
  NativeItem *pNStack_68;
  UErrorCode *pUStack_60;
  UErrorCode local_34;
  int local_30;
  int32_t local_2c;
  
  this->pItem = item;
  local_34 = U_ZERO_ERROR;
  pUVar11 = getDataInfo(item->data,item->length,&local_2c,&local_30,&local_34);
  this->pInfo = pUVar11;
  if (U_ZERO_ERROR < local_34) {
    exit(local_34);
  }
  this->length = this->pItem->length - local_30;
  if (pUVar11->isBigEndian == '\0' && pUVar11->charsetFamily == '\0') {
    this->bytes = this->pItem->data + local_30;
  }
  else {
    uVar16 = 0;
    pErrorCode = &local_34;
    pUVar12 = udata_openSwapper_63(pUVar11->isBigEndian,pUVar11->charsetFamily,'\0','\0',&local_34);
    inData = (void *)(ulong)(uint)local_34;
    if (U_ZERO_ERROR < local_34) {
      pUVar12 = (UDataSwapper *)this;
      setItem();
      if (((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) &&
         (pNStack_68 = this, pUStack_60 = &local_34,
         udata_swapDataHeader_63(pUVar12,inData,-1,(void *)0x0,pErrorCode),
         *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
        uVar6 = *(undefined4 *)((long)inData + 0xc);
        uStack_70 = (ulong)(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  (uint)uVar6 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar6 >> 0x10),uVar6)) >>
                                                  0x20),uVar6) >> 0x18),(char)((uint)uVar6 >> 8)),
                                     (ushort)(byte)uVar6) & 0xffffff00ffffff);
        UVar8 = uprv_isInvariantUString_63((UChar *)&uStack_70,4);
        if (UVar8 == '\0') {
          builtin_strncpy(acStack_9c,"????",4);
        }
        else {
          u_UCharsToChars_63((UChar *)&uStack_70,acStack_9c,4);
        }
        lVar14 = 0;
        do {
          if (*(int *)(swapFns[0].dataFormat + lVar14) == *(int *)((long)inData + 0xc)) {
            uVar10 = (**(code **)(swapFns[0].dataFormat + lVar14 + 8))
                               (pUVar12,inData,extraout_EDX,uVar16,pErrorCode);
            code = *pErrorCode;
            if (U_ZERO_ERROR < code) {
              bVar1 = *(byte *)((long)inData + 0xc);
              bVar2 = *(byte *)((long)inData + 0xd);
              bVar3 = *(byte *)((long)inData + 0xe);
              bVar4 = *(byte *)((long)inData + 0xf);
              uStack_80 = (ulong)(uint)(int)acStack_9c[0];
              uStack_88 = (ulong)(uint)(int)acStack_9c[1];
              uStack_90 = (ulong)(uint)(int)acStack_9c[2];
              uStack_98 = (ulong)(uint)(int)acStack_9c[3];
              pcVar15 = u_errorName_63(code);
              udata_printError_63(pUVar12,
                                  "udata_swap(): failure swapping data format %02x.%02x.%02x.%02x (\"%c%c%c%c\") - %s\n"
                                  ,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,uStack_80,
                                  uStack_88,uStack_90,uStack_98,pcVar15);
              return;
            }
            if ((int)(extraout_EDX - 0xf) <= (int)uVar10) {
              return;
            }
            bVar1 = *(byte *)((long)inData + 0xc);
            bVar2 = *(byte *)((long)inData + 0xd);
            uStack_80 = (ulong)*(byte *)((long)inData + 0xe);
            uStack_88 = (ulong)*(byte *)((long)inData + 0xf);
            uStack_90 = (ulong)(uint)(int)acStack_9c[0];
            uStack_98 = (ulong)(uint)(int)acStack_9c[1];
            uStack_78 = (ulong)(uint)(int)acStack_9c[2];
            uVar17 = (uint)acStack_9c[3];
            pcVar15 = u_errorName_63(code);
            udata_printError_63(pUVar12,
                                "udata_swap() warning: swapped only %d out of %d bytes - data format %02x.%02x.%02x.%02x (\"%c%c%c%c\")\n"
                                ,(ulong)uVar10,(ulong)extraout_EDX,(ulong)bVar1,(ulong)bVar2,
                                uStack_80,uStack_88,uStack_90,uStack_98,uStack_78,(ulong)uVar17,
                                pcVar15);
            return;
          }
          lVar14 = lVar14 + 0x10;
        } while (lVar14 != 0x110);
        udata_printError_63(pUVar12,
                            "udata_swap(): unknown data format %02x.%02x.%02x.%02x (\"%c%c%c%c\")\n"
                            ,(ulong)*(byte *)((long)inData + 0xc),
                            (ulong)*(byte *)((long)inData + 0xd),
                            (ulong)*(byte *)((long)inData + 0xe),
                            (ulong)*(byte *)((long)inData + 0xf),(ulong)(uint)(int)acStack_9c[0],
                            (ulong)(uint)(int)acStack_9c[1],(ulong)(uint)(int)acStack_9c[2],
                            (ulong)(uint)(int)acStack_9c[3]);
        *pErrorCode = U_UNSUPPORTED_ERROR;
      }
      return;
    }
    pUVar12->printError = printError;
    pUVar12->printErrorContext = _stderr;
    pIVar7 = this->pItem;
    iVar5 = pIVar7->length;
    iVar9 = -1;
    if (-1 < iVar5) {
      iVar9 = iVar5;
    }
    puVar13 = (uint8_t *)operator_new__((long)iVar9);
    this->swapped = puVar13;
    (*swap)(pUVar12,pIVar7->data,iVar5,puVar13,&local_34);
    pUVar11 = getDataInfo(this->swapped,this->pItem->length,&local_2c,&local_30,&local_34);
    this->pInfo = pUVar11;
    this->bytes = this->swapped + local_30;
    udata_closeSwapper_63(pUVar12);
  }
  return;
}

Assistant:

void setItem(const Item *item, UDataSwapFn *swap) {
        pItem=item;
        int32_t infoLength, itemHeaderLength;
        UErrorCode errorCode=U_ZERO_ERROR;
        pInfo=::getDataInfo(pItem->data, pItem->length, infoLength, itemHeaderLength, &errorCode);
        if(U_FAILURE(errorCode)) {
            exit(errorCode); // should succeed because readFile() checks headers
        }
        length=pItem->length-itemHeaderLength;

        if(pInfo->isBigEndian==U_IS_BIG_ENDIAN && pInfo->charsetFamily==U_CHARSET_FAMILY) {
            bytes=pItem->data+itemHeaderLength;
        } else {
            UDataSwapper *ds=udata_openSwapper((UBool)pInfo->isBigEndian, pInfo->charsetFamily, U_IS_BIG_ENDIAN, U_CHARSET_FAMILY, &errorCode);
            if(U_FAILURE(errorCode)) {
                fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                        pItem->name, u_errorName(errorCode));
                exit(errorCode);
            }

            ds->printError=printError;
            ds->printErrorContext=stderr;

            swapped=new uint8_t[pItem->length];
            if(swapped==NULL) {
                fprintf(stderr, "icupkg: unable to allocate memory for swapping \"%s\"\n", pItem->name);
                exit(U_MEMORY_ALLOCATION_ERROR);
            }
            swap(ds, pItem->data, pItem->length, swapped, &errorCode);
            pInfo=::getDataInfo(swapped, pItem->length, infoLength, itemHeaderLength, &errorCode);
            bytes=swapped+itemHeaderLength;
            udata_closeSwapper(ds);
        }
    }